

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

void __thiscall wasm::I64ToI32Lowering::visitCallIndirect(I64ToI32Lowering *this,CallIndirect *curr)

{
  Signature SVar1;
  Fatal local_1c0;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  CallIndirect *local_18;
  CallIndirect *curr_local;
  
  local_18 = curr;
  if (curr->isReturn == true) {
    SVar1 = HeapType::getSignature(&curr->heapType);
    if (SVar1.results.id.id == 3) {
      Fatal::Fatal(&local_1c0);
      Fatal::operator<<(&local_1c0,
                        (char (*) [62])
                        "i64 to i32 lowering of return_call values not yet implemented");
      Fatal::~Fatal(&local_1c0);
    }
  }
  local_38._M_unused._M_object = &local_18;
  pcStack_20 = std::
               _Function_handler<wasm::CallIndirect_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp:282:13)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<wasm::CallIndirect_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp:282:13)>
             ::_M_manager;
  local_38._8_8_ = this;
  visitGenericCall<wasm::CallIndirect>(this,local_18,(BuilderFunc<wasm::CallIndirect> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    if (curr->isReturn && curr->heapType.getSignature().results == Type::i64) {
      Fatal()
        << "i64 to i32 lowering of return_call values not yet implemented";
    }
    visitGenericCall<CallIndirect>(
      curr, [&](std::vector<Expression*>& args, Type results) {
        std::vector<Type> params;
        for (const auto& param : curr->heapType.getSignature().params) {
          if (param == Type::i64) {
            params.push_back(Type::i32);
            params.push_back(Type::i32);
          } else {
            params.push_back(param);
          }
        }
        return builder->makeCallIndirect(curr->table,
                                         curr->target,
                                         args,
                                         Signature(Type(params), results),
                                         curr->isReturn);
      });
  }